

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_setType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = (sysbvm_tuple_t *)*arguments;
  if (psVar1 == (sysbvm_tuple_t *)0x0 || ((ulong)psVar1 & 0xf) != 0) {
    sysbvm_error("Cannot set the type of an immediate value.");
    psVar1 = (sysbvm_tuple_t *)*arguments;
  }
  *psVar1 = arguments[1];
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_setType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error("Cannot set the type of an immediate value.");
    
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)arguments[0], arguments[1]);
    return SYSBVM_VOID_TUPLE;
}